

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintCommand.h
# Opt level: O0

void __thiscall PrintCommand::~PrintCommand(PrintCommand *this)

{
  PrintCommand *this_local;
  
  (this->super_Command)._vptr_Command = (_func_int **)&PTR_execute_0012d848;
  std::__cxx11::string::~string((string *)&this->message);
  Command::~Command(&this->super_Command);
  return;
}

Assistant:

~PrintCommand() override = default;